

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::i32_Store_(w3Interp *this)

{
  pointer *ppwVar1;
  int32_t iVar2;
  Value *pVVar3;
  int32_t *piVar4;
  
  pVVar3 = w3Stack::value(&this->super_w3Stack,Tag_i32);
  iVar2 = pVVar3->i32;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  piVar4 = (int32_t *)LoadStore(this,4);
  *piVar4 = iVar2;
  return;
}

Assistant:

INTERP (i32_Store_)
{
    const uint32_t a = pop_u32 ();
    *(uint32_t*)LoadStore (4) = a;
}